

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O2

void absl::lts_20250127::ascii_internal::AsciiStrCaseFoldImpl<false,true>
               (Nonnull<char_*> dst,Nullable<const_char_*> src,size_t size)

{
  size_t i;
  
  for (i = 0; size != i; i = i + 1) {
    dst[i] = ((byte)(src[i] + 0xbfU) < 0x1a) << 5 ^ src[i];
  }
  return;
}

Assistant:

constexpr void AsciiStrCaseFoldImpl(absl::Nonnull<char*> dst,
                                    absl::Nullable<const char*> src,
                                    size_t size) {
  // The upper- and lowercase versions of ASCII characters differ by only 1 bit.
  // When we need to flip the case, we can xor with this bit to achieve the
  // desired result. Note that the choice of 'a' and 'A' here is arbitrary. We
  // could have chosen 'z' and 'Z', or any other pair of characters as they all
  // have the same single bit difference.
  constexpr unsigned char kAsciiCaseBitFlip = 'a' ^ 'A';

  for (size_t i = 0; i < size; ++i) {
    unsigned char v = static_cast<unsigned char>(src[i]);
    if ABSL_INTERNAL_CONSTEXPR_SINCE_CXX17 (Naive) {
      v ^= AsciiInAZRangeNaive<ToUpper>(v) ? kAsciiCaseBitFlip : 0;
    } else {
      v ^= AsciiInAZRange<ToUpper>(v) ? kAsciiCaseBitFlip : 0;
    }
    dst[i] = static_cast<char>(v);
  }